

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stats_print(_func_void_void_ptr_char_ptr *write_cb,void *cbopaque,char *opts)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint64_t *oldp;
  uint uVar5;
  undefined8 extraout_RDX;
  bool bVar6;
  char *format;
  char *pcVar7;
  undefined7 uVar9;
  undefined8 uVar8;
  undefined8 in_R9;
  undefined7 uVar11;
  undefined8 uVar10;
  undefined8 in_R10;
  undefined7 uVar13;
  undefined8 uVar12;
  undefined8 in_R11;
  undefined7 uVar15;
  undefined8 uVar14;
  undefined8 unaff_R12;
  undefined7 uVar16;
  undefined8 unaff_R13;
  undefined7 uVar19;
  ulong uVar17;
  ulong uVar18;
  _Bool bv;
  emitter_t emitter;
  _Bool bv2;
  size_t bsz;
  char *cpv;
  size_t miblen;
  ssize_t ssv;
  size_t sv;
  size_t sz_19;
  size_t sssz;
  size_t cpsz;
  uint local_c0;
  uint local_bc;
  undefined4 local_b8;
  uint nlextents;
  uint nbins;
  uint uv;
  size_t sz;
  ulong local_98;
  size_t ssz;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  uint nhbins;
  uint32_t u32v;
  ssize_t ssv2;
  size_t usz;
  size_t u64sz;
  uint64_t epoch;
  
  oldp = &epoch;
  epoch = 1;
  u64sz = 8;
  uVar8 = 0;
  iVar3 = je_mallctl("epoch",oldp,&u64sz,oldp,8);
  if (iVar3 != 0) {
    if (iVar3 == 0xb) {
      malloc_write("<jemalloc>: Memory allocation failure in mallctl(\"epoch\", ...)\n");
      return;
    }
    pcVar7 = "<jemalloc>: Failure in mallctl(\"epoch\", ...)\n";
    goto LAB_00140dc9;
  }
  uVar15 = (undefined7)((ulong)in_R11 >> 8);
  uVar13 = (undefined7)((ulong)in_R10 >> 8);
  uVar11 = (undefined7)((ulong)in_R9 >> 8);
  uVar9 = (undefined7)((ulong)uVar8 >> 8);
  uVar16 = (undefined7)((ulong)unaff_R12 >> 8);
  uVar19 = (undefined7)((ulong)unaff_R13 >> 8);
  if (opts != (char *)0x0) {
    bVar2 = 0;
    bVar6 = true;
    uVar14 = CONCAT71(uVar15,1);
    uVar12 = CONCAT71(uVar13,1);
    uVar10 = CONCAT71(uVar11,1);
    uVar8 = CONCAT71(uVar9,1);
    uVar18 = CONCAT71(uVar16,1);
    uVar17 = CONCAT71(uVar19,1);
    local_b8 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    uVar5 = 0;
    do {
      local_5c = (undefined4)uVar8;
      local_60 = (undefined4)uVar10;
      local_64 = (undefined4)uVar12;
      local_68 = (undefined4)uVar14;
      bVar1 = opts[uVar5];
      if (bVar1 < 0x61) {
        if (bVar1 == 0x4a) {
          bVar2 = 1;
        }
        else if (bVar1 == 0) goto LAB_0013f15b;
      }
      else {
        switch(bVar1) {
        case 0x61:
          uVar10 = 0;
          break;
        case 0x62:
          uVar8 = 0;
          break;
        case 99:
        case 0x66:
        case 0x68:
        case 0x69:
        case 0x6a:
        case 0x6b:
          break;
        case 100:
          uVar12 = 0;
          break;
        case 0x65:
          local_b8 = 0;
          break;
        case 0x67:
          bVar6 = false;
          break;
        case 0x6c:
          uVar18 = 0;
          break;
        case 0x6d:
          uVar14 = 0;
          break;
        default:
          if (bVar1 == 0x78) {
            uVar17 = 0;
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  bVar6 = true;
  emitter.output = emitter_output_table;
  local_68 = (undefined4)CONCAT71(uVar15,1);
  local_64 = (undefined4)CONCAT71(uVar13,1);
  local_60 = (undefined4)CONCAT71(uVar11,1);
  local_5c = (undefined4)CONCAT71(uVar9,1);
  uVar18 = CONCAT71(uVar16,1);
  uVar17 = CONCAT71(uVar19,1);
  local_b8 = (undefined4)CONCAT71((int7)((ulong)oldp >> 8),1);
  goto LAB_0013f187;
LAB_00140dc2:
  pcVar7 = "<jemalloc>: Failure in xmallctlbymib()\n";
LAB_00140dc9:
  malloc_write(pcVar7);
  abort();
LAB_0013f15b:
  emitter.output = (emitter_output_t)(~bVar2 & 1);
LAB_0013f187:
  uVar5 = (uint)uVar17;
  emitter.item_at_depth = false;
  emitter.emitted_key = false;
  emitter.nesting_depth = 0;
  emitter.write_cb = write_cb;
  emitter.cbopaque = cbopaque;
  if (emitter.output == emitter_output_json) {
    emitter_printf(&emitter,"{");
    emitter.nesting_depth = emitter.nesting_depth + 1;
    emitter._28_2_ = emitter._28_2_ & 0xff00;
  }
  else {
    emitter_printf(&emitter,"%s","");
  }
  emitter_table_printf(&emitter,"___ Begin jemalloc statistics ___\n");
  emitter_json_object_kv_begin(&emitter,"jemalloc");
  if (!bVar6) {
LAB_00140c9a:
    stats_print_helper(&emitter,(_Bool)((byte)local_68 & 1),(_Bool)((byte)local_64 & 1),
                       (_Bool)((byte)local_60 & 1),(_Bool)((byte)local_5c & 1),
                       (_Bool)((byte)uVar18 & 1),(_Bool)((byte)uVar5 & 1),
                       (_Bool)((byte)local_b8 & 1));
    if (emitter.output == emitter_output_json) {
      emitter.nesting_depth = emitter.nesting_depth + -1;
      emitter.item_at_depth = true;
      emitter_printf(&emitter,"\n");
      pcVar7 = "\t";
      if (emitter.output != emitter_output_json) {
        pcVar7 = " ";
      }
      if (0 < emitter.nesting_depth) {
        iVar4 = emitter.nesting_depth << (emitter.output != emitter_output_json);
        iVar3 = 1;
        if (1 < iVar4) {
          iVar3 = iVar4;
        }
        do {
          emitter_printf(&emitter,"%s",pcVar7);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      emitter_printf(&emitter,"}");
    }
    emitter_table_printf(&emitter,"--- End jemalloc statistics ---\n");
    if (emitter.output == emitter_output_json) {
      emitter.nesting_depth = emitter.nesting_depth + -1;
      emitter.item_at_depth = true;
      emitter_printf(&emitter,"\n}\n");
    }
    return;
  }
  bsz = 1;
  usz = 4;
  ssz = 8;
  sssz = 8;
  cpsz = 8;
  sz = 8;
  iVar3 = je_mallctl("version",&cpv,&sz,(void *)0x0,0);
  if (iVar3 == 0) {
    emitter_kv_note(&emitter,"version","Version",emitter_type_string,&cpv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
    emitter_dict_begin(&emitter,"config","Build-time option settings");
    sz = 1;
    iVar3 = je_mallctl("config.cache_oblivious",&bv,&sz,(void *)0x0,0);
    if (iVar3 == 0) {
      emitter_kv_note(&emitter,"cache_oblivious","config.cache_oblivious",emitter_type_bool,&bv,
                      (char *)0x0,emitter_type_bool,(void *)0x0);
      sz = 1;
      iVar3 = je_mallctl("config.debug",&bv,&sz,(void *)0x0,0);
      if (iVar3 == 0) {
        emitter_kv_note(&emitter,"debug","config.debug",emitter_type_bool,&bv,(char *)0x0,
                        emitter_type_bool,(void *)0x0);
        sz = 1;
        iVar3 = je_mallctl("config.fill",&bv,&sz,(void *)0x0,0);
        if (iVar3 == 0) {
          emitter_kv_note(&emitter,"fill","config.fill",emitter_type_bool,&bv,(char *)0x0,
                          emitter_type_bool,(void *)0x0);
          sz = 1;
          iVar3 = je_mallctl("config.lazy_lock",&bv,&sz,(void *)0x0,0);
          if (iVar3 == 0) {
            emitter_kv_note(&emitter,"lazy_lock","config.lazy_lock",emitter_type_bool,&bv,
                            (char *)0x0,emitter_type_bool,(void *)0x0);
            emitter_kv_note(&emitter,"malloc_conf","config.malloc_conf",emitter_type_string,
                            &config_malloc_conf,(char *)0x0,emitter_type_bool,(void *)0x0);
            sz = 1;
            iVar3 = je_mallctl("config.opt_safety_checks",&bv,&sz,(void *)0x0,0);
            if (iVar3 == 0) {
              emitter_kv_note(&emitter,"opt_safety_checks","config.opt_safety_checks",
                              emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,(void *)0x0);
              sz = 1;
              iVar3 = je_mallctl("config.prof",&bv,&sz,(void *)0x0,0);
              if (iVar3 == 0) {
                emitter_kv_note(&emitter,"prof","config.prof",emitter_type_bool,&bv,(char *)0x0,
                                emitter_type_bool,(void *)0x0);
                sz = 1;
                iVar3 = je_mallctl("config.prof_libgcc",&bv,&sz,(void *)0x0,0);
                if (iVar3 == 0) {
                  emitter_kv_note(&emitter,"prof_libgcc","config.prof_libgcc",emitter_type_bool,&bv,
                                  (char *)0x0,emitter_type_bool,(void *)0x0);
                  sz = 1;
                  iVar3 = je_mallctl("config.prof_libunwind",&bv,&sz,(void *)0x0,0);
                  if (iVar3 == 0) {
                    emitter_kv_note(&emitter,"prof_libunwind","config.prof_libunwind",
                                    emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,(void *)0x0)
                    ;
                    sz = 1;
                    iVar3 = je_mallctl("config.stats",&bv,&sz,(void *)0x0,0);
                    if (iVar3 == 0) {
                      emitter_kv_note(&emitter,"stats","config.stats",emitter_type_bool,&bv,
                                      (char *)0x0,emitter_type_bool,(void *)0x0);
                      sz = 1;
                      iVar3 = je_mallctl("config.utrace",&bv,&sz,(void *)0x0,0);
                      if (iVar3 == 0) {
                        emitter_kv_note(&emitter,"utrace","config.utrace",emitter_type_bool,&bv,
                                        (char *)0x0,emitter_type_bool,(void *)0x0);
                        sz = 1;
                        iVar3 = je_mallctl("config.xmalloc",&bv,&sz,(void *)0x0,0);
                        if (iVar3 == 0) {
                          emitter_kv_note(&emitter,"xmalloc","config.xmalloc",emitter_type_bool,&bv,
                                          (char *)0x0,emitter_type_bool,(void *)0x0);
                          if (emitter.output == emitter_output_table) {
                            emitter.nesting_depth = emitter.nesting_depth + -1;
                            emitter.item_at_depth = true;
                          }
                          else if (emitter.output == emitter_output_json) {
                            emitter.nesting_depth = emitter.nesting_depth + -1;
                            emitter.item_at_depth = true;
                            emitter_printf(&emitter,"\n");
                            pcVar7 = "\t";
                            if (emitter.output != emitter_output_json) {
                              pcVar7 = " ";
                            }
                            if (0 < emitter.nesting_depth) {
                              iVar4 = emitter.nesting_depth <<
                                      (emitter.output != emitter_output_json);
                              iVar3 = 1;
                              if (1 < iVar4) {
                                iVar3 = iVar4;
                              }
                              do {
                                emitter_printf(&emitter,"%s",pcVar7);
                                iVar3 = iVar3 + -1;
                              } while (iVar3 != 0);
                            }
                            emitter_printf(&emitter,"}");
                          }
                          emitter_dict_begin(&emitter,"opt","Run-time option settings");
                          iVar3 = je_mallctl("opt.abort",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"abort","opt.abort",emitter_type_bool,&bv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.abort_conf",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"abort_conf","opt.abort_conf",emitter_type_bool
                                            ,&bv,(char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.confirm_conf",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"confirm_conf","opt.confirm_conf",
                                            emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.retain",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"retain","opt.retain",emitter_type_bool,&bv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.dss",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"dss","opt.dss",emitter_type_string,&cpv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.narenas",&uv,&usz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"narenas","opt.narenas",emitter_type_unsigned,
                                            &uv,(char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.percpu_arena",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"percpu_arena","opt.percpu_arena",
                                            emitter_type_string,&cpv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.oversize_threshold",&sv,&ssz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"oversize_threshold","opt.oversize_threshold",
                                            emitter_type_size,&sv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.metadata_thp",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"metadata_thp","opt.metadata_thp",
                                            emitter_type_string,&cpv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.background_thread",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            iVar3 = je_mallctl("background_thread",&bv2,&bsz,(void *)0x0,0);
                            if (iVar3 == 0) {
                              emitter_kv_note(&emitter,"background_thread","opt.background_thread",
                                              emitter_type_bool,&bv,"background_thread",
                                              emitter_type_bool,&bv2);
                            }
                          }
                          iVar3 = je_mallctl("opt.dirty_decay_ms",&ssv,&sssz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            iVar3 = je_mallctl("arenas.dirty_decay_ms",&ssv2,&sssz,(void *)0x0,0);
                            if (iVar3 == 0) {
                              emitter_kv_note(&emitter,"dirty_decay_ms","opt.dirty_decay_ms",
                                              emitter_type_ssize,&ssv,"arenas.dirty_decay_ms",
                                              emitter_type_ssize,&ssv2);
                            }
                          }
                          iVar3 = je_mallctl("opt.muzzy_decay_ms",&ssv,&sssz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            iVar3 = je_mallctl("arenas.muzzy_decay_ms",&ssv2,&sssz,(void *)0x0,0);
                            if (iVar3 == 0) {
                              emitter_kv_note(&emitter,"muzzy_decay_ms","opt.muzzy_decay_ms",
                                              emitter_type_ssize,&ssv,"arenas.muzzy_decay_ms",
                                              emitter_type_ssize,&ssv2);
                            }
                          }
                          iVar3 = je_mallctl("opt.lg_extent_max_active_fit",&sv,&ssz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"lg_extent_max_active_fit",
                                            "opt.lg_extent_max_active_fit",emitter_type_size,&sv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.junk",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"junk","opt.junk",emitter_type_string,&cpv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.zero",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"zero","opt.zero",emitter_type_bool,&bv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.utrace",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"utrace","opt.utrace",emitter_type_bool,&bv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.xmalloc",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"xmalloc","opt.xmalloc",emitter_type_bool,&bv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.tcache",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"tcache","opt.tcache",emitter_type_bool,&bv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.lg_tcache_max",&ssv,&sssz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"lg_tcache_max","opt.lg_tcache_max",
                                            emitter_type_ssize,&ssv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.thp",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"thp","opt.thp",emitter_type_string,&cpv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.prof",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"prof","opt.prof",emitter_type_bool,&bv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.prof_prefix",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"prof_prefix","opt.prof_prefix",
                                            emitter_type_string,&cpv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.prof_active",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            iVar3 = je_mallctl("prof.active",&bv2,&bsz,(void *)0x0,0);
                            if (iVar3 == 0) {
                              emitter_kv_note(&emitter,"prof_active","opt.prof_active",
                                              emitter_type_bool,&bv,"prof.active",emitter_type_bool,
                                              &bv2);
                            }
                          }
                          iVar3 = je_mallctl("opt.prof_thread_active_init",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            iVar3 = je_mallctl("prof.thread_active_init",&bv2,&bsz,(void *)0x0,0);
                            if (iVar3 == 0) {
                              emitter_kv_note(&emitter,"prof_thread_active_init",
                                              "opt.prof_thread_active_init",emitter_type_bool,&bv,
                                              "prof.thread_active_init",emitter_type_bool,&bv2);
                            }
                          }
                          iVar3 = je_mallctl("opt.lg_prof_sample",&ssv,&sssz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            iVar3 = je_mallctl("prof.lg_sample",&ssv2,&sssz,(void *)0x0,0);
                            if (iVar3 == 0) {
                              emitter_kv_note(&emitter,"lg_prof_sample","opt.lg_prof_sample",
                                              emitter_type_ssize,&ssv,"prof.lg_sample",
                                              emitter_type_ssize,&ssv2);
                            }
                          }
                          iVar3 = je_mallctl("opt.prof_accum",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"prof_accum","opt.prof_accum",emitter_type_bool
                                            ,&bv,(char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.lg_prof_interval",&ssv,&sssz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"lg_prof_interval","opt.lg_prof_interval",
                                            emitter_type_ssize,&ssv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.prof_gdump",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"prof_gdump","opt.prof_gdump",emitter_type_bool
                                            ,&bv,(char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.prof_final",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"prof_final","opt.prof_final",emitter_type_bool
                                            ,&bv,(char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.prof_leak",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"prof_leak","opt.prof_leak",emitter_type_bool,
                                            &bv,(char *)0x0,emitter_type_bool,(void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.stats_print",&bv,&bsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"stats_print","opt.stats_print",
                                            emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          iVar3 = je_mallctl("opt.stats_print_opts",&cpv,&cpsz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"stats_print_opts","opt.stats_print_opts",
                                            emitter_type_string,&cpv,(char *)0x0,emitter_type_bool,
                                            (void *)0x0);
                          }
                          if (emitter.output == emitter_output_table) {
                            emitter.nesting_depth = emitter.nesting_depth + -1;
                            emitter.item_at_depth = true;
                          }
                          else if (emitter.output == emitter_output_json) {
                            emitter.nesting_depth = emitter.nesting_depth + -1;
                            emitter.item_at_depth = true;
                            emitter_printf(&emitter,"\n");
                            pcVar7 = "\t";
                            if (emitter.output != emitter_output_json) {
                              pcVar7 = " ";
                            }
                            if (0 < emitter.nesting_depth) {
                              iVar4 = emitter.nesting_depth <<
                                      (emitter.output != emitter_output_json);
                              iVar3 = 1;
                              if (1 < iVar4) {
                                iVar3 = iVar4;
                              }
                              do {
                                emitter_printf(&emitter,"%s",pcVar7);
                                iVar3 = iVar3 + -1;
                              } while (iVar3 != 0);
                            }
                            emitter_printf(&emitter,"}");
                          }
                          emitter_json_object_kv_begin(&emitter,"arenas");
                          sz = 4;
                          iVar3 = je_mallctl("arenas.narenas",&uv,&sz,(void *)0x0,0);
                          if (iVar3 == 0) {
                            emitter_kv_note(&emitter,"narenas","Arenas",emitter_type_unsigned,&uv,
                                            (char *)0x0,emitter_type_bool,(void *)0x0);
                            sz = 8;
                            iVar3 = je_mallctl("arenas.dirty_decay_ms",&ssv,&sz,(void *)0x0,0);
                            if (iVar3 == 0) {
                              emitter_json_kv(&emitter,"dirty_decay_ms",emitter_type_ssize,&ssv);
                              sz = 8;
                              iVar3 = je_mallctl("arenas.muzzy_decay_ms",&ssv,&sz,(void *)0x0,0);
                              if (iVar3 == 0) {
                                emitter_json_kv(&emitter,"muzzy_decay_ms",emitter_type_ssize,&ssv);
                                sz = 8;
                                iVar3 = je_mallctl("arenas.quantum",&sv,&sz,(void *)0x0,0);
                                if (iVar3 == 0) {
                                  emitter_kv_note(&emitter,"quantum","Quantum size",
                                                  emitter_type_size,&sv,(char *)0x0,
                                                  emitter_type_bool,(void *)0x0);
                                  sz = 8;
                                  iVar3 = je_mallctl("arenas.page",&sv,&sz,(void *)0x0,0);
                                  if (iVar3 == 0) {
                                    emitter_kv_note(&emitter,"page","Page size",emitter_type_size,
                                                    &sv,(char *)0x0,emitter_type_bool,(void *)0x0);
                                    iVar3 = je_mallctl("arenas.tcache_max",&sv,&ssz,(void *)0x0,0);
                                    if (iVar3 == 0) {
                                      emitter_kv_note(&emitter,"tcache_max",
                                                      "Maximum thread-cached size class",
                                                      emitter_type_size,&sv,(char *)0x0,
                                                      emitter_type_bool,(void *)0x0);
                                    }
                                    sz = 4;
                                    iVar3 = je_mallctl("arenas.nbins",&nbins,&sz,(void *)0x0,0);
                                    if (iVar3 == 0) {
                                      emitter_kv_note(&emitter,"nbins","Number of bin size classes",
                                                      emitter_type_unsigned,&nbins,(char *)0x0,
                                                      emitter_type_bool,(void *)0x0);
                                      sz = 4;
                                      iVar3 = je_mallctl("arenas.nhbins",&nhbins,&sz,(void *)0x0,0);
                                      if (iVar3 == 0) {
                                        emitter_kv_note(&emitter,"nhbins",
                                                        "Number of thread-cache bin size classes",
                                                        emitter_type_unsigned,&nhbins,(char *)0x0,
                                                        emitter_type_bool,(void *)0x0);
                                        local_bc = uVar5;
                                        if (emitter.output == emitter_output_json) {
                                          local_c0 = (uint)uVar18;
                                          emitter_json_array_kv_begin(&emitter,"bin");
                                          if (nbins != 0) {
                                            uVar18 = 0;
                                            do {
                                              if (emitter.output == emitter_output_json) {
                                                if (emitter.emitted_key == true) {
                                                  emitter._28_2_ = emitter._28_2_ & 0xff;
                                                }
                                                else {
                                                  pcVar7 = "";
                                                  if (emitter.item_at_depth != false) {
                                                    pcVar7 = ",";
                                                  }
                                                  emitter_printf(&emitter,"%s\n",pcVar7);
                                                  pcVar7 = "\t";
                                                  if (emitter.output != emitter_output_json) {
                                                    pcVar7 = " ";
                                                  }
                                                  if (0 < emitter.nesting_depth) {
                                                    iVar3 = emitter.nesting_depth <<
                                                            (emitter.output != emitter_output_json);
                                                    if (iVar3 < 2) {
                                                      iVar3 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(&emitter,"%s",pcVar7);
                                                      iVar3 = iVar3 + -1;
                                                    } while (iVar3 != 0);
                                                  }
                                                }
                                                emitter_printf(&emitter,"{");
                                                emitter.nesting_depth = emitter.nesting_depth + 1;
                                                emitter._28_2_ = emitter._28_2_ & 0xff00;
                                              }
                                              miblen = 7;
                                              sz_19 = 8;
                                              iVar3 = je_mallctlnametomib("arenas.bin.0.size",&sz,
                                                                          &miblen);
                                              if (iVar3 != 0) {
                                                format = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar7 = "arenas.bin.0.size";
                                                goto LAB_00140e21;
                                              }
                                              local_98 = uVar18;
                                              iVar3 = je_mallctlbymib(&sz,miblen,&sv,&sz_19,
                                                                      (void *)0x0,0);
                                              if (iVar3 != 0) goto LAB_00140dc2;
                                              emitter_json_kv(&emitter,"size",emitter_type_size,&sv)
                                              ;
                                              miblen = 7;
                                              sz_19 = 4;
                                              iVar3 = je_mallctlnametomib("arenas.bin.0.nregs",&sz,
                                                                          &miblen);
                                              if (iVar3 != 0) {
                                                format = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar7 = "arenas.bin.0.nregs";
                                                goto LAB_00140e21;
                                              }
                                              local_98 = uVar18;
                                              iVar3 = je_mallctlbymib(&sz,miblen,&u32v,&sz_19,
                                                                      (void *)0x0,0);
                                              if (iVar3 != 0) goto LAB_00140dc2;
                                              emitter_json_kv(&emitter,"nregs",emitter_type_uint32,
                                                              &u32v);
                                              miblen = 7;
                                              sz_19 = 8;
                                              iVar3 = je_mallctlnametomib("arenas.bin.0.slab_size",
                                                                          &sz,&miblen);
                                              if (iVar3 != 0) {
                                                format = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar7 = "arenas.bin.0.slab_size";
                                                goto LAB_00140e21;
                                              }
                                              local_98 = uVar18;
                                              iVar3 = je_mallctlbymib(&sz,miblen,&sv,&sz_19,
                                                                      (void *)0x0,0);
                                              if (iVar3 != 0) goto LAB_00140dc2;
                                              emitter_json_kv(&emitter,"slab_size",emitter_type_size
                                                              ,&sv);
                                              miblen = 7;
                                              sz_19 = 4;
                                              iVar3 = je_mallctlnametomib("arenas.bin.0.nshards",&sz
                                                                          ,&miblen);
                                              if (iVar3 != 0) {
                                                format = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar7 = "arenas.bin.0.nshards";
                                                goto LAB_00140e21;
                                              }
                                              local_98 = uVar18;
                                              iVar3 = je_mallctlbymib(&sz,miblen,&u32v,&sz_19,
                                                                      (void *)0x0,0);
                                              if (iVar3 != 0) goto LAB_00140dc2;
                                              emitter_json_kv(&emitter,"nshards",emitter_type_uint32
                                                              ,&u32v);
                                              if (emitter.output == emitter_output_json) {
                                                emitter.nesting_depth = emitter.nesting_depth + -1;
                                                emitter.item_at_depth = true;
                                                emitter_printf(&emitter,"\n");
                                                pcVar7 = "\t";
                                                if (emitter.output != emitter_output_json) {
                                                  pcVar7 = " ";
                                                }
                                                if (0 < emitter.nesting_depth) {
                                                  iVar3 = emitter.nesting_depth <<
                                                          (emitter.output != emitter_output_json);
                                                  if (iVar3 < 2) {
                                                    iVar3 = 1;
                                                  }
                                                  do {
                                                    emitter_printf(&emitter,"%s",pcVar7);
                                                    iVar3 = iVar3 + -1;
                                                  } while (iVar3 != 0);
                                                }
                                                emitter_printf(&emitter,"}");
                                              }
                                              uVar18 = uVar18 + 1;
                                            } while (uVar18 < nbins);
                                          }
                                          uVar18 = (ulong)local_c0;
                                          uVar17 = (ulong)local_bc;
                                          if (emitter.output == emitter_output_json) {
                                            emitter.nesting_depth = emitter.nesting_depth + -1;
                                            emitter.item_at_depth = true;
                                            emitter_printf(&emitter,"\n");
                                            pcVar7 = "\t";
                                            if (emitter.output != emitter_output_json) {
                                              pcVar7 = " ";
                                            }
                                            if (0 < emitter.nesting_depth) {
                                              iVar4 = emitter.nesting_depth <<
                                                      (emitter.output != emitter_output_json);
                                              iVar3 = 1;
                                              if (1 < iVar4) {
                                                iVar3 = iVar4;
                                              }
                                              do {
                                                emitter_printf(&emitter,"%s",pcVar7);
                                                iVar3 = iVar3 + -1;
                                              } while (iVar3 != 0);
                                            }
                                            emitter_printf(&emitter,"]");
                                          }
                                        }
                                        uVar5 = (uint)uVar17;
                                        sz = 4;
                                        iVar3 = je_mallctl("arenas.nlextents",&nlextents,&sz,
                                                           (void *)0x0,0);
                                        if (iVar3 == 0) {
                                          emitter_kv_note(&emitter,"nlextents",
                                                          "Number of large size classes",
                                                          emitter_type_unsigned,&nlextents,
                                                          (char *)0x0,emitter_type_bool,(void *)0x0)
                                          ;
                                          if (emitter.output == emitter_output_json) {
                                            local_c0 = (uint)uVar18;
                                            emitter_json_array_kv_begin(&emitter,"lextent");
                                            if (nlextents != 0) {
                                              uVar18 = 0;
                                              do {
                                                if (emitter.output == emitter_output_json) {
                                                  if (emitter.emitted_key == true) {
                                                    emitter._28_2_ = emitter._28_2_ & 0xff;
                                                  }
                                                  else {
                                                    pcVar7 = "";
                                                    if (emitter.item_at_depth != false) {
                                                      pcVar7 = ",";
                                                    }
                                                    emitter_printf(&emitter,"%s\n",pcVar7);
                                                    pcVar7 = "\t";
                                                    if (emitter.output != emitter_output_json) {
                                                      pcVar7 = " ";
                                                    }
                                                    if (0 < emitter.nesting_depth) {
                                                      iVar3 = emitter.nesting_depth <<
                                                              (emitter.output != emitter_output_json
                                                              );
                                                      if (iVar3 < 2) {
                                                        iVar3 = 1;
                                                      }
                                                      do {
                                                        emitter_printf(&emitter,"%s",pcVar7);
                                                        iVar3 = iVar3 + -1;
                                                      } while (iVar3 != 0);
                                                    }
                                                  }
                                                  emitter_printf(&emitter,"{");
                                                  emitter.nesting_depth = emitter.nesting_depth + 1;
                                                  emitter._28_2_ = emitter._28_2_ & 0xff00;
                                                  uVar17 = (ulong)local_bc;
                                                }
                                                miblen = 7;
                                                sz_19 = 8;
                                                iVar3 = je_mallctlnametomib("arenas.lextent.0.size",
                                                                            &sz,&miblen);
                                                if (iVar3 != 0) {
                                                  format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar7 = "arenas.lextent.0.size";
                                                  goto LAB_00140e21;
                                                }
                                                local_98 = uVar18;
                                                iVar3 = je_mallctlbymib(&sz,miblen,&sv,&sz_19,
                                                                        (void *)0x0,0);
                                                if (iVar3 != 0) goto LAB_00140dc2;
                                                emitter_json_kv(&emitter,"size",emitter_type_size,
                                                                &sv);
                                                if (emitter.output == emitter_output_json) {
                                                  emitter.nesting_depth = emitter.nesting_depth + -1
                                                  ;
                                                  emitter.item_at_depth = true;
                                                  emitter_printf(&emitter,"\n");
                                                  pcVar7 = "\t";
                                                  if (emitter.output != emitter_output_json) {
                                                    pcVar7 = " ";
                                                  }
                                                  if (0 < emitter.nesting_depth) {
                                                    iVar3 = emitter.nesting_depth <<
                                                            (emitter.output != emitter_output_json);
                                                    if (iVar3 < 2) {
                                                      iVar3 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(&emitter,"%s",pcVar7);
                                                      iVar3 = iVar3 + -1;
                                                    } while (iVar3 != 0);
                                                  }
                                                  emitter_printf(&emitter,"}");
                                                  uVar17 = (ulong)local_bc;
                                                }
                                                uVar5 = (uint)uVar17;
                                                uVar18 = uVar18 + 1;
                                              } while (uVar18 < nlextents);
                                            }
                                            uVar18 = (ulong)local_c0;
                                            if (emitter.output == emitter_output_json) {
                                              emitter.nesting_depth = emitter.nesting_depth + -1;
                                              emitter.item_at_depth = true;
                                              emitter_printf(&emitter,"\n");
                                              pcVar7 = "\t";
                                              if (emitter.output != emitter_output_json) {
                                                pcVar7 = " ";
                                              }
                                              if (0 < emitter.nesting_depth) {
                                                iVar4 = emitter.nesting_depth <<
                                                        (emitter.output != emitter_output_json);
                                                iVar3 = 1;
                                                if (1 < iVar4) {
                                                  iVar3 = iVar4;
                                                }
                                                do {
                                                  emitter_printf(&emitter,"%s",pcVar7);
                                                  iVar3 = iVar3 + -1;
                                                } while (iVar3 != 0);
                                              }
                                              emitter_printf(&emitter,"]");
                                            }
                                          }
                                          if (emitter.output == emitter_output_json) {
                                            emitter.nesting_depth = emitter.nesting_depth + -1;
                                            emitter.item_at_depth = true;
                                            emitter_printf(&emitter,"\n");
                                            pcVar7 = "\t";
                                            if (emitter.output != emitter_output_json) {
                                              pcVar7 = " ";
                                            }
                                            if (0 < emitter.nesting_depth) {
                                              iVar4 = emitter.nesting_depth <<
                                                      (emitter.output != emitter_output_json);
                                              iVar3 = 1;
                                              if (1 < iVar4) {
                                                iVar3 = iVar4;
                                              }
                                              do {
                                                emitter_printf(&emitter,"%s",pcVar7);
                                                iVar3 = iVar3 + -1;
                                              } while (iVar3 != 0);
                                            }
                                            emitter_printf(&emitter,"}");
                                          }
                                          goto LAB_00140c9a;
                                        }
                                        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                        pcVar7 = "arenas.nlextents";
                                      }
                                      else {
                                        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                        pcVar7 = "arenas.nhbins";
                                      }
                                    }
                                    else {
                                      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                      pcVar7 = "arenas.nbins";
                                    }
                                  }
                                  else {
                                    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                    pcVar7 = "arenas.page";
                                  }
                                }
                                else {
                                  format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                  pcVar7 = "arenas.quantum";
                                }
                              }
                              else {
                                format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                                pcVar7 = "arenas.muzzy_decay_ms";
                              }
                            }
                            else {
                              format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                              pcVar7 = "arenas.dirty_decay_ms";
                            }
                          }
                          else {
                            format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                            pcVar7 = "arenas.narenas";
                          }
                        }
                        else {
                          format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                          pcVar7 = "config.xmalloc";
                        }
                      }
                      else {
                        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                        pcVar7 = "config.utrace";
                      }
                    }
                    else {
                      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                      pcVar7 = "config.stats";
                    }
                  }
                  else {
                    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                    pcVar7 = "config.prof_libunwind";
                  }
                }
                else {
                  format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                  pcVar7 = "config.prof_libgcc";
                }
              }
              else {
                format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
                pcVar7 = "config.prof";
              }
            }
            else {
              format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
              pcVar7 = "config.opt_safety_checks";
            }
          }
          else {
            format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
            pcVar7 = "config.lazy_lock";
          }
        }
        else {
          format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
          pcVar7 = "config.fill";
        }
      }
      else {
        format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
        pcVar7 = "config.debug";
      }
    }
    else {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar7 = "config.cache_oblivious";
    }
  }
  else {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar7 = "version";
  }
LAB_00140e21:
  malloc_printf(format,pcVar7);
  abort();
}

Assistant:

void
stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	int err;
	uint64_t epoch;
	size_t u64sz;
#define OPTION(o, v, d, s) bool v = d;
	STATS_PRINT_OPTIONS
#undef OPTION

	/*
	 * Refresh stats, in case mallctl() was called by the application.
	 *
	 * Check for OOM here, since refreshing the ctl cache can trigger
	 * allocation.  In practice, none of the subsequent mallctl()-related
	 * calls in this function will cause OOM if this one succeeds.
	 * */
	epoch = 1;
	u64sz = sizeof(uint64_t);
	err = je_mallctl("epoch", (void *)&epoch, &u64sz, (void *)&epoch,
	    sizeof(uint64_t));
	if (err != 0) {
		if (err == EAGAIN) {
			malloc_write("<jemalloc>: Memory allocation failure in "
			    "mallctl(\"epoch\", ...)\n");
			return;
		}
		malloc_write("<jemalloc>: Failure in mallctl(\"epoch\", "
		    "...)\n");
		abort();
	}

	if (opts != NULL) {
		for (unsigned i = 0; opts[i] != '\0'; i++) {
			switch (opts[i]) {
#define OPTION(o, v, d, s) case o: v = s; break;
				STATS_PRINT_OPTIONS
#undef OPTION
			default:;
			}
		}
	}

	emitter_t emitter;
	emitter_init(&emitter,
	    json ? emitter_output_json : emitter_output_table, write_cb,
	    cbopaque);
	emitter_begin(&emitter);
	emitter_table_printf(&emitter, "___ Begin jemalloc statistics ___\n");
	emitter_json_object_kv_begin(&emitter, "jemalloc");

	if (general) {
		stats_general_print(&emitter);
	}
	if (config_stats) {
		stats_print_helper(&emitter, merged, destroyed, unmerged,
		    bins, large, mutex, extents);
	}

	emitter_json_object_end(&emitter); /* Closes the "jemalloc" dict. */
	emitter_table_printf(&emitter, "--- End jemalloc statistics ---\n");
	emitter_end(&emitter);
}